

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::Proxy_Function_Base::Proxy_Function_Base
          (Proxy_Function_Base *this,
          vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *t_types,int t_arity
          )

{
  pointer pTVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  
  this->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Proxy_Function_Base_0046ece0;
  pTVar1 = (t_types->
           super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (this->m_types).super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (t_types->super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_types).super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
  _M_impl.super__Vector_impl_data._M_finish = pTVar1;
  (this->m_types).super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (t_types->super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (t_types->super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (t_types->super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (t_types->super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_arity = t_arity;
  this->m_has_arithmetic_param = false;
  pTVar1 = (this->m_types).
           super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar3 = &pTVar1[1].m_flags;
  uVar4 = 0;
  do {
    uVar4 = uVar4 + 1;
    if ((ulong)(((long)(this->m_types).
                       super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x18) <= uVar4)
    {
      return;
    }
    uVar2 = *puVar3;
    puVar3 = puVar3 + 6;
  } while ((uVar2 & 0x10) == 0);
  this->m_has_arithmetic_param = true;
  return;
}

Assistant:

Proxy_Function_Base(std::vector<Type_Info> t_types, int t_arity)
          : m_types(std::move(t_types))
          , m_arity(t_arity)
          , m_has_arithmetic_param(false) {
        for (size_t i = 1; i < m_types.size(); ++i) {
          if (m_types[i].is_arithmetic()) {
            m_has_arithmetic_param = true;
            return;
          }
        }
      }